

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

void project_feature_handler_KILL_DOOR(project_feature_handler_context_t *context)

{
  loc_conflict grid_00;
  chunk_conflict *c;
  _Bool _Var1;
  loc_conflict grid;
  project_feature_handler_context_t *context_local;
  
  grid_00 = context->grid;
  _Var1 = square_isdoor((chunk *)cave,grid_00);
  if (_Var1) {
    _Var1 = square_isview((chunk *)cave,grid_00);
    if (_Var1) {
      msg("There is a bright flash of light!");
      context->obvious = true;
      player->upkeep->update = player->upkeep->update | 0xc0;
      square_forget((chunk *)cave,grid_00);
    }
    square_destroy_door((chunk *)cave,grid_00);
    c = cave;
    if (cave->depth == 0) {
      _Var1 = is_daytime();
      expose_to_sun((chunk *)c,(loc)grid_00,_Var1);
    }
  }
  return;
}

Assistant:

static void project_feature_handler_KILL_DOOR(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Destroy all doors */
	if (square_isdoor(cave, grid)) {
		/* Check line of sight */
		if (square_isview(cave, grid)) {
			/* Message */
			msg("There is a bright flash of light!");
			context->obvious = true;

			/* Visibility change */
			player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

			/* Forget the door */
			square_forget(cave, grid);
		}

		/* Destroy the feature */
		square_destroy_door(cave, grid);

		/* On the surface, new terrain may be exposed to the sun. */
		if (cave->depth == 0) expose_to_sun(cave, grid, is_daytime());
	}
}